

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BamStandardIndex_p.cpp
# Opt level: O0

void __thiscall BamTools::Internal::BamStandardIndex::CloseFile(BamStandardIndex *this)

{
  bool bVar1;
  long in_RDI;
  BamStandardIndex *in_stack_ffffffffffffffd8;
  
  bVar1 = IsDeviceOpen(in_stack_ffffffffffffffd8);
  if (bVar1) {
    (**(code **)(**(long **)(in_RDI + 0x58) + 0x10))();
    if (*(long **)(in_RDI + 0x58) != (long *)0x0) {
      (**(code **)(**(long **)(in_RDI + 0x58) + 8))();
    }
    *(undefined8 *)(in_RDI + 0x58) = 0;
  }
  std::
  vector<BamTools::Internal::BaiReferenceSummary,_std::allocator<BamTools::Internal::BaiReferenceSummary>_>
  ::clear((vector<BamTools::Internal::BaiReferenceSummary,_std::allocator<BamTools::Internal::BaiReferenceSummary>_>
           *)0x28b1b7);
  if (*(void **)(in_RDI + 0x60) != (void *)0x0) {
    operator_delete__(*(void **)(in_RDI + 0x60));
  }
  *(undefined8 *)(in_RDI + 0x60) = 0;
  *(undefined4 *)(in_RDI + 0x50) = 0;
  return;
}

Assistant:

void BamStandardIndex::CloseFile()
{

    // close file stream
    if (IsDeviceOpen()) {
        m_resources.Device->Close();
        delete m_resources.Device;
        m_resources.Device = 0;
    }

    // clear index file summary data
    m_indexFileSummary.clear();

    // clean up I/O buffer
    delete[] m_resources.Buffer;
    m_resources.Buffer = 0;
    m_bufferLength = 0;
}